

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

void qclab::printMatrix2x2<qclab::dense::SquareMatrix<std::complex<float>>>
               (SquareMatrix<std::complex<float>_> *mat)

{
  complex<float> val;
  
  if (mat->size_ == 2) {
    print<float>((complex<float>)mat);
    print<float>((complex<float>)mat);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    val._M_value = std::ostream::put('\0');
    std::ostream::flush();
    print<float>(val);
    print<float>(val);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    return;
  }
  __assert_fail("mat.rows() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x61,
                "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<std::complex<float>>]"
               );
}

Assistant:

void printMatrix2x2( const T& mat ) {
    assert( mat.rows() == 2 ) ;
    assert( mat.cols() == 2 ) ;
    print( mat(0,0) ) ; print( mat(0,1) ) ; std::cout << std::endl ;
    print( mat(1,0) ) ; print( mat(1,1) ) ; std::cout << std::endl ;
  }